

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::DoubleParameter::set_allocated_range
          (DoubleParameter *this,DoubleRange *range)

{
  ulong uVar1;
  Arena *submessage_arena;
  Arena *message_arena;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  message_arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    message_arena = *(Arena **)message_arena;
  }
  clear_AllowedValues(this);
  if (range != (DoubleRange *)0x0) {
    submessage_arena = (Arena *)(range->super_MessageLite)._internal_metadata_.ptr_;
    if (((ulong)submessage_arena & 2) == 0) {
      if (((ulong)submessage_arena & 1) != 0) {
        submessage_arena = *(Arena **)((ulong)submessage_arena & 0xfffffffffffffffc);
      }
    }
    else {
      submessage_arena = (Arena *)0x0;
    }
    if (message_arena != submessage_arena) {
      range = (DoubleRange *)
              google::protobuf::internal::GetOwnedMessageInternal
                        (message_arena,&range->super_MessageLite,submessage_arena);
    }
    this->_oneof_case_[0] = 10;
    (this->AllowedValues_).range_ = range;
  }
  return;
}

Assistant:

void DoubleParameter::set_allocated_range(::CoreML::Specification::DoubleRange* range) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_AllowedValues();
  if (range) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
        ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<
            ::PROTOBUF_NAMESPACE_ID::MessageLite>::GetOwningArena(
                reinterpret_cast<::PROTOBUF_NAMESPACE_ID::MessageLite*>(range));
    if (message_arena != submessage_arena) {
      range = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, range, submessage_arena);
    }
    set_has_range();
    AllowedValues_.range_ = range;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.DoubleParameter.range)
}